

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spirv_cross::SPIRBlock::Case,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRBlock::Case,_8UL>::operator=
          (SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *this,
          SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *other)

{
  undefined4 uVar1;
  Case *pCVar2;
  Case *pCVar3;
  ulong local_28;
  size_t i;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *other_local;
  SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size);
    for (local_28 = 0;
        local_28 < (other->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size;
        local_28 = local_28 + 1) {
      pCVar2 = (this->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr + local_28;
      pCVar3 = (other->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr + local_28;
      pCVar2->value = pCVar3->value;
      uVar1 = *(undefined4 *)&pCVar3->field_0xc;
      pCVar2->block = (BlockID)(pCVar3->block).id;
      *(undefined4 *)&pCVar2->field_0xc = uVar1;
    }
    (this->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size =
         (other->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}